

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O1

bool senjo::NumberParam<unsigned_long>
               (string *name,unsigned_long *value,char **params,bool *invalid)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  unsigned_long uVar6;
  char *pcVar7;
  
  __n = name->_M_string_length;
  if ((__n == 0) || (pcVar7 = *params, pcVar7 == (char *)0x0)) {
    bVar2 = false;
  }
  else {
    iVar1 = strncmp(pcVar7,(name->_M_dataplus)._M_p,__n);
    if ((iVar1 == 0) && ((pcVar7[__n] == '\0' || (iVar1 = isspace((int)pcVar7[__n]), iVar1 != 0))))
    {
      *params = pcVar7 + __n;
      cVar3 = pcVar7[__n];
      bVar2 = true;
      if (cVar3 != '\0') {
        pcVar7 = pcVar7 + __n;
        do {
          pcVar7 = pcVar7 + 1;
          iVar1 = isspace((int)cVar3);
          if (iVar1 == 0) break;
          *params = pcVar7;
          cVar3 = *pcVar7;
        } while (cVar3 != '\0');
      }
    }
    else {
      bVar2 = false;
    }
  }
  if (bVar2 != false) {
    pcVar7 = *params;
    lVar4 = 1;
    if ((pcVar7 != (char *)0x0) && (*pcVar7 == '-')) {
      *params = pcVar7 + 1;
      lVar4 = -1;
    }
    pcVar7 = *params;
    if ((pcVar7 != (char *)0x0) && ((int)*pcVar7 - 0x30U < 10)) {
      pcVar5 = pcVar7 + 1;
      *params = pcVar5;
      uVar6 = (long)*pcVar7 - 0x30;
      *value = uVar6;
      cVar3 = pcVar7[1];
      iVar1 = (int)cVar3;
      if (iVar1 - 0x30U < 10) {
        pcVar7 = pcVar7 + 2;
        do {
          pcVar5 = pcVar7;
          *params = pcVar5;
          uVar6 = ((long)pcVar5[-1] + uVar6 * 10) - 0x30;
          *value = uVar6;
          cVar3 = *pcVar5;
          iVar1 = (int)cVar3;
          pcVar7 = pcVar5 + 1;
        } while (iVar1 - 0x30U < 10);
      }
      if ((cVar3 == '\0') || (iVar1 = isspace(iVar1), iVar1 != 0)) {
        *value = uVar6 * lVar4;
        cVar3 = *pcVar5;
        while( true ) {
          if (cVar3 == '\0') {
            return bVar2;
          }
          pcVar5 = pcVar5 + 1;
          iVar1 = isspace((int)cVar3);
          if (iVar1 == 0) break;
          *params = pcVar5;
          cVar3 = *pcVar5;
        }
        return bVar2;
      }
    }
    *invalid = true;
  }
  return bVar2;
}

Assistant:

static inline bool NumberParam(const std::string& name, Number& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  int sign = 1;
  if (params && (*params == '-')) {
    sign = -1;
    ++params;
  }
  if (!params || !*params || !isdigit(*params)) {
    invalid = true;
  }
  else {
    value = (*params++ - '0');
    while (*params && isdigit(*params)) {
      value = ((10 * value) + (*params++ - '0'));
    }
    if (*params && !isspace(*params)) {
      invalid = true;
    }
    else {
      value *= sign;
      NextWord(params);
    }
  }
  return true;
}